

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

Vec_Wec_t * Abc_ExorcismNtk2Esop(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *vCubeIn;
  int k;
  int i;
  int nFanins;
  int nProducts;
  int nOuts;
  int nIns;
  char *pCube;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Wec_t *vEsop;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  Abc_NtkCoNum(pNtk);
  i = 0;
  for (vCubeIn._4_4_ = 0; iVar2 = Abc_NtkCoNum(pNtk), vCubeIn._4_4_ < iVar2;
      vCubeIn._4_4_ = vCubeIn._4_4_ + 1) {
    pAVar4 = Abc_NtkCo(pNtk,vCubeIn._4_4_);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
    iVar2 = Abc_ObjIsNode(pAVar4);
    if (iVar2 == 0) {
      i = i + 1;
    }
    else {
      iVar2 = Abc_NodeIsConst(pAVar4);
      if (iVar2 == 0) {
        iVar2 = Abc_SopGetCubeNum((char *)(pAVar4->field_5).pData);
        i = iVar2 + i;
      }
      else {
        iVar2 = Abc_NodeIsConst1(pAVar4);
        if (iVar2 != 0) {
          i = i + 1;
        }
      }
    }
  }
  for (vCubeIn._4_4_ = 0; iVar2 = Abc_NtkCiNum(pNtk), vCubeIn._4_4_ < iVar2;
      vCubeIn._4_4_ = vCubeIn._4_4_ + 1) {
    pAVar4 = Abc_NtkCi(pNtk,vCubeIn._4_4_);
    pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)vCubeIn._4_4_;
  }
  p = Vec_WecAlloc(i + 1);
  vCubeIn._4_4_ = 0;
  do {
    iVar2 = Abc_NtkCoNum(pNtk);
    if (iVar2 <= vCubeIn._4_4_) {
      return p;
    }
    pAVar4 = Abc_NtkCo(pNtk,vCubeIn._4_4_);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
    iVar2 = Abc_NodeIsConst(pAVar4);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjFaninNum(pAVar4);
      for (_nOuts = (char *)(pAVar4->field_5).pData; *_nOuts != '\0'; _nOuts = _nOuts + (iVar2 + 3))
      {
        p_00 = Vec_WecPushLevel(p);
        Vec_IntGrow(p_00,iVar1 + 2);
        for (vCubeIn._0_4_ = 0; iVar3 = Abc_ObjFaninNum(pAVar4), (int)vCubeIn < iVar3;
            vCubeIn._0_4_ = (int)vCubeIn + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,(int)vCubeIn);
          pAVar5 = Abc_ObjFanin0Ntk(pAVar5);
          if (iVar1 <= (pAVar5->field_6).iTemp) {
            __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nIns",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                          ,0x3e6,"Vec_Wec_t *Abc_ExorcismNtk2Esop(Abc_Ntk_t *)");
          }
          if (_nOuts[(int)vCubeIn] == '0') {
            Vec_IntPush(p_00,(int)vCubeIn * 2 + 1);
          }
          else if (_nOuts[(int)vCubeIn] == '1') {
            Vec_IntPush(p_00,(int)vCubeIn << 1);
          }
        }
        Vec_IntPush(p_00,-(vCubeIn._4_4_ + 1));
      }
    }
    vCubeIn._4_4_ = vCubeIn._4_4_ + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vEsop = NULL;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCube;
    int nIns, nOuts, nProducts, nFanins, i, k;

    nIns = Abc_NtkCiNum( pNtk );
    nOuts = Abc_NtkCoNum( pNtk );

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    vEsop = Vec_WecAlloc( nProducts+1 );

    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( Abc_NodeIsConst(pDriver) ) continue;

        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Vec_Int_t *vCubeIn = Vec_WecPushLevel( vEsop );
            Vec_IntGrow( vCubeIn, nIns+2 );

            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nIns );
                if ( pCube[k] == '0' )
                {
                    Vec_IntPush( vCubeIn, 2*k + 1 );
                }
                else if ( pCube[k] == '1' )
                {
                    Vec_IntPush( vCubeIn, 2*k );
                }
            }
            Vec_IntPush( vCubeIn, -( i + 1 ) );
        }
    }

    return vEsop;
}